

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyhttpimpl.cpp
# Opt level: O0

void __thiscall
QNetworkReplyHttpImplPrivate::wantUploadDataSlot(QNetworkReplyHttpImplPrivate *this,qint64 maxSize)

{
  bool bVar1;
  undefined1 uVar2;
  QNetworkReplyHttpImpl *pQVar3;
  element_type *peVar4;
  char *_t4;
  qint64 in_RSI;
  QNetworkReplyHttpImplPrivate *in_RDI;
  long in_FS_OFFSET;
  char *data;
  QNetworkReplyHttpImpl *q;
  QByteArray dataArray;
  qint64 currentUploadDataLength;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 _t3;
  QByteArray local_28;
  long local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = q_func(in_RDI);
  _t3 = (undefined1)((ulong)pQVar3 >> 0x38);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI->uploadByteDevice);
  if (bVar1) {
    local_10 = 0;
    peVar4 = std::
             __shared_ptr_access<QNonContiguousByteDevice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QNonContiguousByteDevice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x31e998);
    _t4 = (char *)(**(code **)(*(long *)peVar4 + 0x60))(peVar4,in_RSI,&local_10);
    if (local_10 == 0) {
      in_RDI->uploadDeviceChoking = true;
    }
    else {
      in_RDI->uploadDeviceChoking = false;
      local_28.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_28.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
      local_28.d.size = -0x5555555555555556;
      QByteArray::QByteArray(&local_28,_t4,local_10);
      peVar4 = std::
               __shared_ptr_access<QNonContiguousByteDevice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QNonContiguousByteDevice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x31ea33);
      uVar2 = (**(code **)(*(long *)peVar4 + 0x70))();
      peVar4 = std::
               __shared_ptr_access<QNonContiguousByteDevice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QNonContiguousByteDevice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x31ea51);
      (**(code **)(*(long *)peVar4 + 0x88))();
      QNetworkReplyHttpImpl::haveUploadData
                ((QNetworkReplyHttpImpl *)in_RDI,in_RSI,
                 (QByteArray *)CONCAT17(uVar2,in_stack_ffffffffffffffa8),(bool)_t3,(qint64)_t4);
      QByteArray::~QByteArray((QByteArray *)0x31ea87);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QNetworkReplyHttpImplPrivate::wantUploadDataSlot(qint64 maxSize)
{
    Q_Q(QNetworkReplyHttpImpl);

    if (!uploadByteDevice) // uploadByteDevice is no longer available
        return;

    // call readPointer
    qint64 currentUploadDataLength = 0;
    char *data = const_cast<char*>(uploadByteDevice->readPointer(maxSize, currentUploadDataLength));

    if (currentUploadDataLength == 0) {
        uploadDeviceChoking = true;
        // No bytes from upload byte device. There will be bytes later, it will emit readyRead()
        // and our uploadByteDeviceReadyReadSlot() is called.
        return;
    } else {
        uploadDeviceChoking = false;
    }

    // Let's make a copy of this data
    QByteArray dataArray(data, currentUploadDataLength);

    // Communicate back to HTTP thread
    emit q->haveUploadData(uploadByteDevicePosition, dataArray, uploadByteDevice->atEnd(), uploadByteDevice->size());
}